

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall Am_Object_Data::note_parts(Am_Object_Data *this)

{
  Am_Slot_Data *pAVar1;
  Am_Slot local_30;
  Am_Object_Data *local_28;
  Am_Object_Data *curr_part;
  Am_Object_Context local_11;
  Am_Object_Data *pAStack_10;
  Am_Object_Context oc;
  Am_Object_Data *this_local;
  
  pAStack_10 = this;
  Am_Object_Context::Am_Object_Context(&local_11,false);
  Am_Slot::Am_Slot((Am_Slot *)&curr_part,&this->owner_slot);
  am_CList::Slot_Event(&(this->owner_slot).dependencies,&local_11,(Am_Slot *)&curr_part);
  for (local_28 = this->first_part; local_28 != (Am_Object_Data *)0x0;
      local_28 = local_28->next_part) {
    note_parts(local_28);
    pAVar1 = &local_28->part_slot;
    Am_Slot::Am_Slot(&local_30,&local_28->part_slot);
    am_CList::Slot_Event(&pAVar1->dependencies,&local_11,&local_30);
  }
  return;
}

Assistant:

void
Am_Object_Data::note_parts()
{
  Am_Object_Context oc(false);
  owner_slot.dependencies.Slot_Event(&oc, &owner_slot);
  Am_Object_Data *curr_part;
  for (curr_part = first_part; curr_part != nullptr;
       curr_part = curr_part->next_part) {
    curr_part->note_parts();
    curr_part->part_slot.dependencies.Slot_Event(&oc, &curr_part->part_slot);
  }
}